

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O2

Vec_Ptr_t * Abc_NtkAssignIDs(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar1;
  void *pvVar2;
  int iVar3;
  
  p = Abc_NtkDfs(pNtk,0);
  Abc_NtkCleanCopy(pNtk);
  for (iVar3 = 0; iVar3 < pNtk->vCis->nSize; iVar3 = iVar3 + 1) {
    pAVar1 = Abc_NtkCi(pNtk,iVar3);
    (pAVar1->field_6).iTemp = iVar3;
  }
  for (iVar3 = 0; iVar3 < p->nSize; iVar3 = iVar3 + 1) {
    pvVar2 = Vec_PtrEntry(p,iVar3);
    *(int *)((long)pvVar2 + 0x40) = pNtk->vCis->nSize + iVar3;
  }
  for (iVar3 = 0; iVar3 < pNtk->vCos->nSize; iVar3 = iVar3 + 1) {
    pAVar1 = Abc_NtkCo(pNtk,iVar3);
    (pAVar1->field_6).iTemp = pNtk->vCis->nSize + p->nSize + iVar3;
  }
  return p;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////
 
////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Ptr_t * Abc_NtkAssignIDs( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    int i;
    vNodes = Abc_NtkDfs( pNtk, 0 );
    Abc_NtkCleanCopy( pNtk );
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->iTemp = i;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        pObj->iTemp = Abc_NtkCiNum(pNtk) + i;
    Abc_NtkForEachCo( pNtk, pObj, i )
        pObj->iTemp = Abc_NtkCiNum(pNtk) + Vec_PtrSize(vNodes) + i;
    return vNodes;
}